

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  rep rVar1;
  ostream *poVar2;
  int elapsed_ms;
  int elapsed_s;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  end;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  start;
  string *in_stack_00010330;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffff68;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff70;
  allocator *__rhs;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff78;
  duration<long,_std::ratio<1L,_1000L>_> local_80;
  int local_74;
  rep local_70;
  duration<long,_std::ratio<1L,_1L>_> local_68;
  int local_5c;
  undefined8 local_58;
  allocator local_39;
  string local_38 [32];
  undefined8 local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(in_stack_ffffffffffffff70);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(in_stack_ffffffffffffff70);
  local_18 = std::chrono::_V2::system_clock::now();
  __rhs = &local_39;
  local_8 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"samples.xml",__rhs);
  read_config_file(in_stack_00010330);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_58 = std::chrono::_V2::system_clock::now();
  local_10 = local_58;
  local_70 = (rep)std::chrono::operator-
                            (in_stack_ffffffffffffff78,
                             (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)__rhs);
  local_68.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                                (in_stack_ffffffffffffff68);
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_68);
  local_5c = (int)rVar1;
  std::chrono::operator-
            (in_stack_ffffffffffffff78,
             (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)__rhs);
  local_80.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                (in_stack_ffffffffffffff68);
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_80);
  local_74 = (int)rVar1;
  poVar2 = std::operator<<((ostream *)&std::cout,"All samples done in ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_5c);
  poVar2 = std::operator<<(poVar2,"s, ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_74 % 1000);
  std::operator<<(poVar2,"ms.\n");
  return 0;
}

Assistant:

int main() {

  // Initialize rand for non-linux targets
  #ifndef __linux__
    srand(time(nullptr));
  #endif

  std::chrono::time_point<std::chrono::system_clock> start, end;
  start = std::chrono::system_clock::now();

  read_config_file("samples.xml");

  end = std::chrono::system_clock::now();
  int elapsed_s =
      std::chrono::duration_cast<std::chrono::seconds>(end - start).count();
  int elapsed_ms =
      std::chrono::duration_cast<std::chrono::milliseconds>(end - start)
          .count();
  std::cout << "All samples done in " << elapsed_s << "s, " << elapsed_ms % 1000
            << "ms.\n";
}